

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

void duckdb::ExpressionBinder::ExtractCorrelatedExpressions(Binder *binder,Expression *expr)

{
  BoundColumnRefExpression *expr_00;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    expr_00 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    if (expr_00->depth != 0) {
      CorrelatedColumnInfo::CorrelatedColumnInfo((CorrelatedColumnInfo *)&local_68,expr_00);
      Binder::AddCorrelatedColumn(binder,(CorrelatedColumnInfo *)&local_68);
      CorrelatedColumnInfo::~CorrelatedColumnInfo((CorrelatedColumnInfo *)&local_68);
    }
  }
  local_68._8_8_ = 0;
  local_50 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression_binder.cpp:238:40)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression_binder.cpp:238:40)>
             ::_M_manager;
  local_68._M_unused._M_object = binder;
  ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_68);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

void ExpressionBinder::ExtractCorrelatedExpressions(Binder &binder, Expression &expr) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_colref = expr.Cast<BoundColumnRefExpression>();
		if (bound_colref.depth > 0) {
			binder.AddCorrelatedColumn(CorrelatedColumnInfo(bound_colref));
		}
	}
	ExpressionIterator::EnumerateChildren(expr,
	                                      [&](Expression &child) { ExtractCorrelatedExpressions(binder, child); });
}